

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_open_filename.c
# Opt level: O0

wchar_t open_filename(archive *a,wchar_t mbs_fn,void *filename)

{
  archive_mstring *aes;
  int *piVar1;
  archive_mstring *in_RDX;
  int in_ESI;
  archive *in_RDI;
  void *unaff_retaddr;
  archive *in_stack_00000008;
  wchar_t r;
  write_file_data *mine;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  wchar_t wVar2;
  
  aes = (archive_mstring *)calloc(1,0x70);
  if (aes == (archive_mstring *)0x0) {
    archive_set_error(in_RDI,0xc,"No memory");
    wVar2 = L'\xffffffe2';
  }
  else {
    if (in_ESI == 0) {
      wVar2 = archive_mstring_copy_wcs(in_RDX,(wchar_t *)aes);
    }
    else {
      wVar2 = archive_mstring_copy_mbs
                        (aes,(char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    }
    if (wVar2 < L'\0') {
      piVar1 = __errno_location();
      if (*piVar1 == 0xc) {
        archive_set_error(in_RDI,0xc,"No memory");
        wVar2 = L'\xffffffe2';
      }
      else {
        if (in_ESI == 0) {
          archive_set_error(in_RDI,-1,"Can\'t convert \'%S\' to MBS",in_RDX);
        }
        else {
          archive_set_error(in_RDI,-1,"Can\'t convert \'%s\' to WCS",in_RDX);
        }
        wVar2 = L'\xffffffe7';
      }
    }
    else {
      *(undefined4 *)&(aes->aes_mbs).s = 0xffffffff;
      wVar2 = archive_write_open(in_stack_00000008,unaff_retaddr,
                                 (undefined1 *)
                                 CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                                 (archive_write_callback *)in_RDI,
                                 (undefined1 *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8));
    }
  }
  return wVar2;
}

Assistant:

static int
open_filename(struct archive *a, int mbs_fn, const void *filename)
{
	struct write_file_data *mine;
	int r;

	mine = (struct write_file_data *)calloc(1, sizeof(*mine));
	if (mine == NULL) {
		archive_set_error(a, ENOMEM, "No memory");
		return (ARCHIVE_FATAL);
	}
	if (mbs_fn)
		r = archive_mstring_copy_mbs(&mine->filename, filename);
	else
		r = archive_mstring_copy_wcs(&mine->filename, filename);
	if (r < 0) {
		if (errno == ENOMEM) {
			archive_set_error(a, ENOMEM, "No memory");
			return (ARCHIVE_FATAL);
		}
		if (mbs_fn)
			archive_set_error(a, ARCHIVE_ERRNO_MISC,
			    "Can't convert '%s' to WCS",
			    (const char *)filename);
		else
			archive_set_error(a, ARCHIVE_ERRNO_MISC,
			    "Can't convert '%S' to MBS",
			    (const wchar_t *)filename);
		return (ARCHIVE_FAILED);
	}
	mine->fd = -1;
	return (archive_write_open(a, mine,
		file_open, file_write, file_close));
}